

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

wchar_t lookup_feat_code(char *code)

{
  int iVar1;
  wchar_t local_1c;
  wchar_t i;
  char *code_local;
  
  local_1c = L'\0';
  while( true ) {
    if ((local_1c < L'\0') || (L'\x19' < local_1c)) {
      __assert_fail("i >= 0 && i < (int) N_ELEMENTS(feat_code_list)",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                    ,0x140,"int lookup_feat_code(const char *)");
    }
    if (feat_code_list[local_1c] == (char *)0x0) {
      return L'\xffffffff';
    }
    iVar1 = strcmp(code,feat_code_list[local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + L'\x01';
  }
  return local_1c;
}

Assistant:

int lookup_feat_code(const char *code)
{
	int i = 0;

	while (1) {
		assert(i >= 0 && i < (int) N_ELEMENTS(feat_code_list));
		if (!feat_code_list[i]) {
			return -1;
		}
		if (streq(code, feat_code_list[i])) {
			break;
		}
		++i;
	}
	return i;
}